

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O3

void __thiscall
btWheelContactPoint::btWheelContactPoint
          (btWheelContactPoint *this,btRigidBody *body0,btRigidBody *body1,
          btVector3 *frictionPosWorld,btVector3 *frictionDirectionWorld,btScalar maxImpulse)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  this->m_body0 = body0;
  this->m_body1 = body1;
  uVar4 = *(undefined8 *)(frictionPosWorld->m_floats + 2);
  *(undefined8 *)(this->m_frictionPositionWorld).m_floats =
       *(undefined8 *)frictionPosWorld->m_floats;
  *(undefined8 *)((this->m_frictionPositionWorld).m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)(frictionDirectionWorld->m_floats + 2);
  *(undefined8 *)(this->m_frictionDirectionWorld).m_floats =
       *(undefined8 *)frictionDirectionWorld->m_floats;
  *(undefined8 *)((this->m_frictionDirectionWorld).m_floats + 2) = uVar4;
  this->m_maxImpulse = maxImpulse;
  fVar6 = frictionPosWorld->m_floats[0] -
          (body0->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  fVar10 = frictionPosWorld->m_floats[1] -
           (body0->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  fVar8 = frictionPosWorld->m_floats[2] -
          (body0->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  fVar1 = frictionDirectionWorld->m_floats[2];
  fVar2 = frictionDirectionWorld->m_floats[0];
  fVar3 = frictionDirectionWorld->m_floats[1];
  fVar15 = fVar10 * fVar1 - fVar3 * fVar8;
  fVar17 = fVar8 * fVar2 - fVar1 * fVar6;
  fVar12 = fVar6 * fVar3 - fVar2 * fVar10;
  fVar5 = *(float *)&body0->field_0x16c * fVar12 +
          *(float *)&(body0->super_btCollisionObject).field_0x14c * fVar15 +
          *(float *)&body0->field_0x15c * fVar17;
  fVar18 = *(float *)&body0->field_0x170 * fVar12 +
           *(float *)&body0->field_0x150 * fVar15 + *(float *)&body0->field_0x160 * fVar17;
  fVar13 = fVar12 * *(float *)&body0->field_0x174 +
           fVar15 * *(float *)&body0->field_0x154 + fVar17 * *(float *)&body0->field_0x164;
  fVar12 = frictionPosWorld->m_floats[0] -
           (body1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  fVar17 = frictionPosWorld->m_floats[1] -
           (body1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  fVar15 = frictionPosWorld->m_floats[2] -
           (body1->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  fVar11 = fVar17 * fVar1 - fVar3 * fVar15;
  fVar14 = fVar15 * fVar2 - fVar1 * fVar12;
  fVar7 = fVar12 * fVar3 - fVar2 * fVar17;
  fVar9 = *(float *)&body1->field_0x16c * fVar7 +
          *(float *)&(body1->super_btCollisionObject).field_0x14c * fVar11 +
          *(float *)&body1->field_0x15c * fVar14;
  fVar16 = *(float *)&body1->field_0x170 * fVar7 +
           *(float *)&body1->field_0x150 * fVar11 + *(float *)&body1->field_0x160 * fVar14;
  fVar7 = fVar7 * *(float *)&body1->field_0x174 +
          fVar11 * *(float *)&body1->field_0x154 + fVar14 * *(float *)&body1->field_0x164;
  this->m_jacDiagABInv =
       1.0 / ((fVar9 * fVar17 - fVar16 * fVar12) * fVar1 +
              (fVar16 * fVar15 - fVar17 * fVar7) * fVar2 + (fVar7 * fVar12 - fVar15 * fVar9) * fVar3
              + body1->m_inverseMass +
             (fVar5 * fVar10 - fVar18 * fVar6) * fVar1 +
             (fVar18 * fVar8 - fVar10 * fVar13) * fVar2 + (fVar13 * fVar6 - fVar8 * fVar5) * fVar3 +
             body0->m_inverseMass);
  return;
}

Assistant:

btWheelContactPoint(btRigidBody* body0,btRigidBody* body1,const btVector3& frictionPosWorld,const btVector3& frictionDirectionWorld, btScalar maxImpulse)
		:m_body0(body0),
		m_body1(body1),
		m_frictionPositionWorld(frictionPosWorld),
		m_frictionDirectionWorld(frictionDirectionWorld),
		m_maxImpulse(maxImpulse)
	{
		btScalar denom0 = body0->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar denom1 = body1->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar	relaxation = 1.f;
		m_jacDiagABInv = relaxation/(denom0+denom1);
	}